

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall World::drow(World *this)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  long *plVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  system("clear");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  if (0 < (this->world_size).super_Point.y) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
      iVar6 = iVar6 + 1;
    } while (iVar6 < (this->world_size).super_Point.y);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  p_Var3 = (this->crearues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->crearues)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      bVar8 = ((ulong)p_Var3[1]._M_left & 1) != 0;
      iVar6 = *(int *)((long)&p_Var3[1]._M_parent + 4);
      pcVar7 = " ";
      if (bVar8) {
        pcVar7 = "#";
      }
      pcVar5 = "";
      if (bVar8) {
        pcVar5 = "";
      }
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar7,pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (iVar6 == (this->world_size).super_Point.y + -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  if (0 < (this->world_size).super_Point.y) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
      iVar6 = iVar6 + 1;
    } while (iVar6 < (this->world_size).super_Point.y);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Evolution: ",0xb);
  plVar4 = (long *)std::ostream::operator<<(poVar2,this->evol);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  this->evol = this->evol + 1;
  return;
}

Assistant:

void drow()
		{
			system("clear");
			cout << "|";
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|" << endl << "|";
			for (auto c : this->crearues)
			{
				cout << c.second.stat();
				if(c.second.point.y == this->world_size.y -1)
					cout << "|" << endl << "|";
			}
			
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|";
			cout << endl << "Evolution: " << evol << endl ;
			evol++;
		}